

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O2

double integrate(function<double_(double)> *func,double a,double b,double h,int threads_num)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int i;
  long lVar5;
  double dVar6;
  double dVar7;
  double result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> threads;
  vector<Argument,_std::allocator<Argument>_> args;
  pthread_mutex_t mutex;
  double local_98;
  double local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  _Vector_base<Argument,_std::allocator<Argument>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_90 = h;
  std::vector<Argument,_std::allocator<Argument>_>::vector
            ((vector<Argument,_std::allocator<Argument>_> *)&local_70,(long)threads_num,
             (allocator_type *)&local_58);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,(long)threads_num,
             (allocator_type *)&local_58);
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  dVar6 = b;
  if (a <= b) {
    dVar6 = a;
  }
  local_98 = 0.0;
  if (a <= b) {
    a = b;
  }
  uVar2 = 0;
  uVar1 = (ulong)(uint)threads_num;
  if (threads_num < 1) {
    uVar1 = uVar2;
  }
  dVar7 = (a - dVar6) / (double)threads_num;
  lVar5 = 0;
  uVar4 = 0;
  while (uVar1 != uVar4) {
    iVar3 = (int)uVar4;
    uVar4 = uVar4 + 1;
    *(undefined8 **)((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->mutex + lVar5) =
         &local_58;
    *(double **)((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->result + lVar5) =
         &local_98;
    *(double *)((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->a + lVar5) =
         (double)iVar3 * dVar7 + dVar6;
    *(double *)((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->b + lVar5) =
         (double)(int)uVar4 * dVar7 + dVar6;
    *(double *)((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->h + lVar5) = local_90;
    *(function<double_(double)> **)
     ((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->func + lVar5) = func;
    pthread_create((pthread_t *)((long)local_88._M_impl.super__Vector_impl_data._M_start + uVar2),
                   (pthread_attr_t *)0x0,integrate_thread,
                   (void *)((long)&(local_70._M_impl.super__Vector_impl_data._M_start)->mutex +
                           lVar5));
    lVar5 = lVar5 + 0x30;
    uVar2 = uVar2 + 8;
  }
  for (uVar2 = 0; dVar6 = local_98, uVar1 != uVar2; uVar2 = uVar2 + 1) {
    pthread_join(local_88._M_impl.super__Vector_impl_data._M_start[uVar2],(void **)0x0);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_88);
  std::_Vector_base<Argument,_std::allocator<Argument>_>::~_Vector_base(&local_70);
  return dVar6;
}

Assistant:

double integrate(std::function<double(double)> const &func, double a, double b, double h, int threads_num){
  std::vector<Argument> args(static_cast<unsigned long>(threads_num));
  std::vector<pthread_t> threads(static_cast<unsigned long>(threads_num));
  pthread_mutex_t mutex = PTHREAD_MUTEX_INITIALIZER;
  if (b < a){
    std::swap(a, b);
  }
  double result = 0;
  double step = (b - a) / threads_num;
  for(auto i = 0; i < threads_num; ++i){
    args[i] = {&mutex, &result, a + step * i, a + step * (i + 1), h, &func};
    pthread_create(threads.data() + i, nullptr, integrate_thread, args.data() + i);
  }
  for(auto i = 0; i < threads_num; ++i) {
    pthread_join(threads[i], nullptr);
  }
  return result;
}